

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZRefPattern.cpp
# Opt level: O0

void __thiscall
TPZRefPattern::CreateMidSideNodes
          (TPZRefPattern *this,TPZGeoEl *gel,int side,TPZVec<long> *newnodeindexes)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  TPZGeoEl *pTVar6;
  long lVar7;
  int64_t iVar8;
  int *piVar9;
  double *pdVar10;
  long *plVar11;
  ostream *poVar12;
  TPZAdmChunkVector<TPZGeoNode,_10> *this_00;
  TPZVec<long> *in_RCX;
  TPZGeoEl *in_RSI;
  long in_RDI;
  bool bVar13;
  REAL RVar14;
  int64_t newindex;
  int k_2;
  REAL dif;
  int k_1;
  int i;
  int smallestDiffIndex;
  REAL smallestDiff;
  TPZManVector<double,_3> newnodecoord_X;
  int iX;
  TPZManVector<double,_3> newnodecoord_xi;
  double coord;
  int k;
  TPZManVector<double,_3> neighbourcoord_X;
  TPZManVector<double,_3> refnodecoord_X;
  int index;
  int j;
  TPZManVector<long,_10> sideindices;
  TPZGeoElSide neighbour;
  TPZGeoElSide gelside;
  TPZManVector<int,_10> sideNodes;
  TPZGeoMesh *gmesh;
  TPZGeoElSide *in_stack_fffffffffffffb48;
  TPZRefPattern *in_stack_fffffffffffffb50;
  TPZAdmChunkVector<TPZGeoNode,_10> *in_stack_fffffffffffffb58;
  TPZGeoElSide *in_stack_fffffffffffffb60;
  undefined4 in_stack_fffffffffffffb68;
  int in_stack_fffffffffffffb6c;
  TPZAdmChunkVector<TPZGeoNode,_10> *in_stack_fffffffffffffb70;
  long *in_stack_fffffffffffffb78;
  TPZManVector<double,_3> *in_stack_fffffffffffffb80;
  int local_274;
  double local_270;
  int local_264;
  int local_260;
  int local_25c;
  double local_258;
  TPZVec<double> local_250;
  int local_214;
  undefined8 local_210;
  TPZVec<double> local_208;
  REAL local_1d0;
  int local_1c4;
  undefined8 local_1c0;
  TPZVec<double> local_1b8;
  undefined8 local_180;
  TPZVec<double> local_178;
  int local_140;
  int local_13c;
  TPZVec<long> local_120 [3];
  TPZGeoElSide local_b0;
  TPZSavable in_stack_ffffffffffffff68;
  TPZGeoEl *in_stack_ffffffffffffff70;
  TPZVec<int> local_70 [2];
  TPZGeoMesh *local_28;
  TPZVec<long> *local_20;
  TPZGeoEl *local_10;
  
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_28 = TPZGeoEl::Mesh(in_RSI);
  TPZManVector<int,_10>::TPZManVector
            ((TPZManVector<int,_10> *)in_stack_fffffffffffffb70,
             CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
  SideNodes(in_stack_fffffffffffffb50,(int)((ulong)in_stack_fffffffffffffb48 >> 0x20),
            (TPZVec<int> *)0x18e41f0);
  TPZGeoElSide::TPZGeoElSide
            (in_stack_fffffffffffffb60,(TPZGeoEl *)in_stack_fffffffffffffb58,
             (int)((ulong)in_stack_fffffffffffffb50 >> 0x20));
  TPZGeoElSide::Neighbour((TPZGeoElSide *)in_stack_fffffffffffffb58);
  TPZManVector<long,_10>::TPZManVector
            ((TPZManVector<long,_10> *)in_stack_fffffffffffffb70,
             CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
  do {
    pTVar6 = TPZGeoElSide::Element(&local_b0);
    bVar13 = false;
    if (pTVar6 != (TPZGeoEl *)0x0) {
      iVar4 = TPZGeoElSide::operator!=(&local_b0,(TPZGeoElSide *)&stack0xffffffffffffff68);
      bVar13 = iVar4 != 0;
    }
    if (!bVar13) goto LAB_018e442c;
    iVar4 = TPZGeoElSide::HasSubElement(in_stack_fffffffffffffb48);
    if (iVar4 != 0) {
      pTVar6 = TPZGeoElSide::Element(&local_b0);
      iVar4 = TPZGeoElSide::Side(&local_b0);
      iVar4 = (**(code **)(*(long *)pTVar6 + 0x150))(pTVar6,iVar4);
      if (1 < iVar4) {
        pTVar6 = TPZGeoElSide::Element(&local_b0);
        iVar4 = TPZGeoElSide::Side(&local_b0);
        (**(code **)(*(long *)pTVar6 + 0x120))(pTVar6,iVar4,local_120);
LAB_018e442c:
        for (local_13c = 0; lVar7 = (long)local_13c, iVar8 = TPZVec<int>::NElements(local_70),
            lVar7 < iVar8; local_13c = local_13c + 1) {
          piVar9 = TPZVec<int>::operator[](local_70,(long)local_13c);
          local_140 = *piVar9;
          local_180 = 0;
          TPZManVector<double,_3>::TPZManVector
                    (in_stack_fffffffffffffb80,(int64_t)in_stack_fffffffffffffb78,
                     (double *)in_stack_fffffffffffffb70);
          local_1c0 = 0;
          TPZManVector<double,_3>::TPZManVector
                    (in_stack_fffffffffffffb80,(int64_t)in_stack_fffffffffffffb78,
                     (double *)in_stack_fffffffffffffb70);
          for (local_1c4 = 0; local_1c4 < 3; local_1c4 = local_1c4 + 1) {
            TPZGeoMesh::NodeVec((TPZGeoMesh *)(in_RDI + 0xb0));
            TPZChunkVector<TPZGeoNode,_10>::operator[]
                      (&in_stack_fffffffffffffb70->super_TPZChunkVector<TPZGeoNode,_10>,
                       CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
            RVar14 = TPZGeoNode::Coord((TPZGeoNode *)in_stack_fffffffffffffb58,
                                       (int)((ulong)in_stack_fffffffffffffb50 >> 0x20));
            local_1d0 = RVar14;
            pdVar10 = TPZVec<double>::operator[](&local_178,(long)local_1c4);
            *pdVar10 = RVar14;
          }
          pTVar6 = Element(in_stack_fffffffffffffb50,(int)((ulong)in_stack_fffffffffffffb48 >> 0x20)
                          );
          (**(code **)(*(long *)pTVar6 + 0x210))();
          local_210 = 0;
          TPZManVector<double,_3>::TPZManVector
                    (in_stack_fffffffffffffb80,(int64_t)in_stack_fffffffffffffb78,
                     (double *)in_stack_fffffffffffffb70);
          local_214 = 0;
          while( true ) {
            iVar4 = local_214;
            pTVar6 = Element(in_stack_fffffffffffffb50,
                             (int)((ulong)in_stack_fffffffffffffb48 >> 0x20));
            iVar5 = (**(code **)(*(long *)pTVar6 + 0x210))();
            if (iVar5 <= iVar4) break;
            pdVar10 = TPZVec<double>::operator[](&local_178,(long)local_214);
            dVar1 = *pdVar10;
            pdVar10 = TPZVec<double>::operator[](&local_208,(long)local_214);
            *pdVar10 = dVar1;
            local_214 = local_214 + 1;
          }
          TPZManVector<double,_3>::TPZManVector
                    ((TPZManVector<double,_3> *)in_stack_fffffffffffffb70,
                     CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
          (**(code **)(*(long *)local_10 + 0x228))(local_10,&local_208,&local_250);
          plVar11 = TPZVec<long>::operator[](local_20,(long)local_140);
          *plVar11 = -1;
          local_258 = -1.0;
          local_25c = -1;
          for (local_260 = 0; iVar8 = TPZVec<long>::NElements(local_120), local_260 < iVar8;
              local_260 = local_260 + 1) {
            for (local_264 = 0; local_264 < 3; local_264 = local_264 + 1) {
              TPZGeoMesh::NodeVec(local_28);
              TPZVec<long>::operator[](local_120,(long)local_260);
              TPZChunkVector<TPZGeoNode,_10>::operator[]
                        (&in_stack_fffffffffffffb70->super_TPZChunkVector<TPZGeoNode,_10>,
                         CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
              RVar14 = TPZGeoNode::Coord((TPZGeoNode *)in_stack_fffffffffffffb58,
                                         (int)((ulong)in_stack_fffffffffffffb50 >> 0x20));
              pdVar10 = TPZVec<double>::operator[](&local_1b8,(long)local_264);
              *pdVar10 = RVar14;
            }
            local_270 = 0.0;
            for (local_274 = 0; local_274 < 3; local_274 = local_274 + 1) {
              pdVar10 = TPZVec<double>::operator[](&local_250,(long)local_274);
              dVar1 = *pdVar10;
              pdVar10 = TPZVec<double>::operator[](&local_1b8,(long)local_274);
              dVar2 = *pdVar10;
              pdVar10 = TPZVec<double>::operator[](&local_250,(long)local_274);
              dVar3 = *pdVar10;
              pdVar10 = TPZVec<double>::operator[](&local_1b8,(long)local_274);
              local_270 = (dVar1 - dVar2) * (dVar3 - *pdVar10) + local_270;
            }
            if (((double)local_25c < 0.0) || (local_270 < local_258)) {
              local_258 = local_270;
              local_25c = local_260;
            }
          }
          if ((local_258 < 0.01) && (iVar8 = TPZVec<long>::NElements(local_120), iVar8 != 0)) {
            plVar11 = TPZVec<long>::operator[](local_120,(long)local_25c);
            lVar7 = *plVar11;
            plVar11 = TPZVec<long>::operator[](local_20,(long)local_140);
            *plVar11 = lVar7;
          }
          if ((0.01 <= local_258) && (iVar8 = TPZVec<long>::NElements(local_120), iVar8 != 0)) {
            std::operator<<((ostream *)&std::cout,
                            "Refpattern is trying to create midnode but there is another node which is not in the right position!\n"
                           );
            std::operator<<((ostream *)&std::cout,
                            "Either the refinement patterns are incompatible or there is an issue with the mapping.\n"
                           );
            poVar12 = std::operator<<((ostream *)&std::cout,"newnodecoord_X(");
            pdVar10 = TPZVec<double>::operator[](&local_250,0);
            poVar12 = (ostream *)std::ostream::operator<<(poVar12,*pdVar10);
            poVar12 = std::operator<<(poVar12,",");
            pdVar10 = TPZVec<double>::operator[](&local_250,1);
            poVar12 = (ostream *)std::ostream::operator<<(poVar12,*pdVar10);
            poVar12 = std::operator<<(poVar12,",");
            pdVar10 = TPZVec<double>::operator[](&local_250,2);
            poVar12 = (ostream *)std::ostream::operator<<(poVar12,*pdVar10);
            poVar12 = std::operator<<(poVar12,")");
            std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
            poVar12 = std::operator<<((ostream *)&std::cout,"neighbourcoord_X(");
            pdVar10 = TPZVec<double>::operator[](&local_1b8,0);
            poVar12 = (ostream *)std::ostream::operator<<(poVar12,*pdVar10);
            poVar12 = std::operator<<(poVar12,",");
            pdVar10 = TPZVec<double>::operator[](&local_1b8,1);
            poVar12 = (ostream *)std::ostream::operator<<(poVar12,*pdVar10);
            poVar12 = std::operator<<(poVar12,",");
            pdVar10 = TPZVec<double>::operator[](&local_1b8,2);
            poVar12 = (ostream *)std::ostream::operator<<(poVar12,*pdVar10);
            in_stack_fffffffffffffb80 = (TPZManVector<double,_3> *)std::operator<<(poVar12,")");
            std::ostream::operator<<
                      (in_stack_fffffffffffffb80,std::endl<char,std::char_traits<char>>);
            pzinternal::DebugStopImpl
                      ((char *)in_stack_ffffffffffffff70,
                       (size_t)in_stack_ffffffffffffff68._vptr_TPZSavable);
          }
          in_stack_fffffffffffffb78 = TPZVec<long>::operator[](local_20,(long)local_140);
          if (*in_stack_fffffffffffffb78 == -1) {
            in_stack_fffffffffffffb70 = TPZGeoMesh::NodeVec(local_28);
            in_stack_fffffffffffffb6c =
                 TPZAdmChunkVector<TPZGeoNode,_10>::AllocateNewElement(in_stack_fffffffffffffb58);
            in_stack_fffffffffffffb48 = (TPZGeoElSide *)(long)in_stack_fffffffffffffb6c;
            this_00 = TPZGeoMesh::NodeVec(local_28);
            in_stack_fffffffffffffb58 =
                 (TPZAdmChunkVector<TPZGeoNode,_10> *)
                 TPZChunkVector<TPZGeoNode,_10>::operator[]
                           (&in_stack_fffffffffffffb70->super_TPZChunkVector<TPZGeoNode,_10>,
                            CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
            TPZGeoNode::Initialize
                      ((TPZGeoNode *)this_00,(TPZVec<double> *)in_stack_fffffffffffffb58,
                       (TPZGeoMesh *)in_stack_fffffffffffffb50);
            in_stack_fffffffffffffb50 =
                 (TPZRefPattern *)TPZVec<long>::operator[](local_20,(long)local_140);
            (in_stack_fffffffffffffb50->super_TPZSavable)._vptr_TPZSavable =
                 (_func_int **)in_stack_fffffffffffffb48;
          }
          TPZManVector<double,_3>::~TPZManVector
                    ((TPZManVector<double,_3> *)in_stack_fffffffffffffb50);
          TPZManVector<double,_3>::~TPZManVector
                    ((TPZManVector<double,_3> *)in_stack_fffffffffffffb50);
          TPZManVector<double,_3>::~TPZManVector
                    ((TPZManVector<double,_3> *)in_stack_fffffffffffffb50);
          TPZManVector<double,_3>::~TPZManVector
                    ((TPZManVector<double,_3> *)in_stack_fffffffffffffb50);
        }
        TPZManVector<long,_10>::~TPZManVector((TPZManVector<long,_10> *)in_stack_fffffffffffffb50);
        TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x18e4fb9);
        TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x18e4fc6);
        TPZManVector<int,_10>::~TPZManVector((TPZManVector<int,_10> *)in_stack_fffffffffffffb50);
        return;
      }
    }
    TPZGeoElSide::Neighbour((TPZGeoElSide *)in_stack_fffffffffffffb58);
    TPZGeoElSide::operator=((TPZGeoElSide *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
    TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x18e4427);
  } while( true );
}

Assistant:

void TPZRefPattern::CreateMidSideNodes(TPZGeoEl * gel, int side, TPZVec<int64_t> &newnodeindexes)
{
	TPZGeoMesh *gmesh = gel->Mesh();
	//SideNodes returns a vector with the indexes of the internal nodes of the side side
	TPZManVector<int> sideNodes;
	SideNodes(side,sideNodes);
	TPZGeoElSide gelside(gel,side);
	TPZGeoElSide neighbour(gelside.Neighbour());
	TPZManVector<int64_t> sideindices(0);
	//checks if a neighbour element has created a midsidenode already
	while(neighbour.Element() && neighbour != gelside){
		if(neighbour.HasSubElement() && neighbour.Element()->NSideSubElements(neighbour.Side()) > 1)
		{
			neighbour.Element()->MidSideNodeIndices(neighbour.Side(),sideindices);
			break;
		}
		neighbour = neighbour.Neighbour();
	}
	for (int j=0;j<sideNodes.NElements();j++){
		int index = sideNodes[j];
		//new node coordinates
		TPZManVector<REAL,3> refnodecoord_X(3,0.);
		TPZManVector<REAL,3> neighbourcoord_X(3,0.);

		for (int k=0;k<3;k++){
            double coord = fRefPatternMesh.NodeVec()[index].Coord(k);
            refnodecoord_X[k] = coord;
        }

		TPZManVector<REAL,3> newnodecoord_xi(Element(0)->Dimension(),0.);

		//getting node coordinates in refpattern mesh: just a matter of adjusting dimension
		for(int iX = 0; iX < Element(0)->Dimension(); iX++) newnodecoord_xi[iX] = refnodecoord_X[iX];

        //coordinates of the node to be created (if it hasnt been created yet)
		TPZManVector<REAL,3> newnodecoord_X(3);
		gel->X(newnodecoord_xi,newnodecoord_X);

		newnodeindexes[index] = -1;
		REAL smallestDiff = -1.;
		int smallestDiffIndex = -1;
		//check if the node has already been created using information previsouly obtained from neighbour
		for(int i=0; i< sideindices.NElements(); i++)
		{
			for(int k=0; k<3; k++) neighbourcoord_X[k] = gmesh->NodeVec()[sideindices[i]].Coord(k);
			REAL dif = 0.;
			for (int k=0;k<3;k++)
			{
				dif += (newnodecoord_X[k] - neighbourcoord_X[k]) * (newnodecoord_X[k] - neighbourcoord_X[k]);
			}
			if(smallestDiffIndex < 0. || smallestDiff > dif)
			{
				smallestDiff = dif;
				smallestDiffIndex = i;
			}
		}
		if (smallestDiff < 1e-2 && sideindices.NElements() != 0)
		{
			newnodeindexes[index] = sideindices[smallestDiffIndex];
		}
		if (smallestDiff >= 1.e-2 && sideindices.NElements() != 0)
		{
#ifdef PZ_LOG
			{
				std::stringstream sout;
				sout << "Incompatible refinement patterns detected\n";
				sout << "Closest node at distance " << smallestDiff << std::endl;
				gel->Print(sout);
				LOGPZ_ERROR(logger,sout.str())
			}
#endif
            std::cout << "Refpattern is trying to create midnode but there is another node which is not in the right position!\n";
            std::cout << "Either the refinement patterns are incompatible or there is an issue with the mapping.\n";
            std::cout << "newnodecoord_X(" << newnodecoord_X[0] << "," << newnodecoord_X[1] << "," << newnodecoord_X[2] << ")" << std::endl;
            std::cout << "neighbourcoord_X(" << neighbourcoord_X[0] << "," << neighbourcoord_X[1] << "," << neighbourcoord_X[2] << ")" << std::endl;
			DebugStop();
		}
		if (newnodeindexes[index] == -1)
		{
			//If no one has created the node yet, it should be created
			int64_t newindex = gmesh->NodeVec().AllocateNewElement();
			gmesh->NodeVec()[newindex].Initialize(newnodecoord_X,*gmesh);
			newnodeindexes[index] = newindex;
		}
	}
}